

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

void on_session_state_changed
               (void *context,SESSION_STATE new_session_state,SESSION_STATE previous_session_state)

{
  int iVar1;
  LINK_INSTANCE *link_instance;
  SESSION_STATE previous_session_state_local;
  SESSION_STATE new_session_state_local;
  void *context_local;
  
  if (new_session_state == SESSION_STATE_MAPPED) {
    if (((*(int *)((long)context + 8) == 1) && ((*(byte *)((long)context + 0x99) & 1) == 0)) &&
       (iVar1 = send_attach((LINK_INSTANCE *)context,*(char **)((long)context + 0x30),0,
                            (role)(*(byte *)((long)context + 0x44) & 1)), iVar1 == 0)) {
      set_link_state((LINK_INSTANCE *)context,LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
    }
  }
  else if (new_session_state == SESSION_STATE_DISCARDING) {
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    set_link_state((LINK_INSTANCE *)context,LINK_STATE_DETACHED);
  }
  else if (new_session_state == SESSION_STATE_ERROR) {
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    set_link_state((LINK_INSTANCE *)context,LINK_STATE_ERROR);
  }
  return;
}

Assistant:

static void on_session_state_changed(void* context, SESSION_STATE new_session_state, SESSION_STATE previous_session_state)
{
    LINK_INSTANCE* link_instance = (LINK_INSTANCE*)context;
    (void)previous_session_state;

    if (new_session_state == SESSION_STATE_MAPPED)
    {
        if ((link_instance->link_state == LINK_STATE_DETACHED) && (!link_instance->is_closed))
        {
            if (send_attach(link_instance, link_instance->name, 0, link_instance->role) == 0)
            {
                set_link_state(link_instance, LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
            }
        }
    }
    else if (new_session_state == SESSION_STATE_DISCARDING)
    {
        remove_all_pending_deliveries(link_instance, true);
        set_link_state(link_instance, LINK_STATE_DETACHED);
    }
    else if (new_session_state == SESSION_STATE_ERROR)
    {
        remove_all_pending_deliveries(link_instance, true);
        set_link_state(link_instance, LINK_STATE_ERROR);
    }
}